

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O3

void __thiscall Flic::readBrun(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  undefined1 local_3d;
  int local_3c;
  int iStack_38;
  uint8_t packets;
  char local_31 [8];
  char count;
  ulong __n;
  
  if (header->height != 0) {
    uVar6 = (uint)(header->depth >> 3);
    __n = (ulong)uVar6;
    uVar4 = 0;
    local_3c = -1;
    do {
      std::istream::read((char *)is,(long)&local_3d);
      uVar1 = header->width;
      if (uVar1 != 0) {
        iVar8 = 0;
        do {
          iStack_38 = iVar8;
          uVar2 = header->height;
          std::istream::read((char *)is,(long)local_31);
          if (local_31[0] < '\0') {
            lVar5 = (long)(int)(((uint)uVar1 * ((uint)uVar2 + local_3c) + iStack_38) * uVar6);
            lVar7 = 0;
            do {
              pvVar3 = operator_new__(__n);
              std::istream::read((char *)is,(long)pvVar3);
              memcpy(frame->pixels + lVar5,pvVar3,__n);
              operator_delete(pvVar3);
              lVar7 = lVar7 + 1;
              iVar8 = (int)local_31[0];
              lVar5 = lVar5 + __n;
            } while (SBORROW8(lVar7,-(long)iVar8) != lVar7 + iVar8 < 0);
            iVar8 = iStack_38 - iVar8;
          }
          else {
            pvVar3 = operator_new__(__n);
            std::istream::read((char *)is,(long)pvVar3);
            if ('\0' < local_31[0]) {
              lVar5 = (long)(int)(((uint)uVar1 * ((uint)uVar2 + local_3c) + iStack_38) * uVar6);
              lVar7 = 0;
              do {
                memcpy(frame->pixels + lVar5,pvVar3,__n);
                lVar7 = lVar7 + 1;
                lVar5 = lVar5 + __n;
              } while (lVar7 < local_31[0]);
            }
            iVar8 = iStack_38 + local_31[0];
            operator_delete(pvVar3);
          }
          uVar1 = header->width;
        } while (iVar8 < (int)(uint)uVar1);
      }
      uVar4 = uVar4 + 1;
      local_3c = local_3c + -1;
    } while (uVar4 < header->height);
  }
  return;
}

Assistant:

void Flic::readBrun(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	for (int y = 0; y < header.height; ++y) {
		uint8_t packets;
		is.read(reinterpret_cast<char*>(&packets), 1);
		int x = 0;
		while (x < header.width) {
			int offset = ((header.height - y - 1) * header.width + x) * bytespp;
			char count;
			is.read(&count, 1);
			if (count >= 0) {
				char *tmp = new char[bytespp];
				is.read(tmp, bytespp);
				for (int j = 0; j < count; ++j) {
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
				}
				x += count;
				delete tmp;
			} else {
				for (int j = 0; j < (-count); ++j) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					delete tmp;
				}
				x += -count;
			}
		}
	}
}